

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_predict.c
# Opt level: O2

int PredictorSetupEncode(TIFF *tif)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  code *pcVar5;
  int iVar6;
  
  piVar1 = (int *)tif->tif_data;
  iVar3 = (**(code **)(piVar1 + 0x1e))();
  iVar6 = 0;
  if ((iVar3 != 0) && (iVar3 = PredictorSetup(tif), iVar3 != 0)) {
    iVar6 = 1;
    if (*piVar1 == 3) {
      *(code **)(piVar1 + 0xc) = fpDiff;
      if (tif->tif_encoderow != PredictorEncodeRow) {
        *(TIFFCodeMethod *)(piVar1 + 6) = tif->tif_encoderow;
        tif->tif_encoderow = PredictorEncodeRow;
        *(TIFFCodeMethod *)(piVar1 + 8) = tif->tif_encodestrip;
        tif->tif_encodestrip = PredictorEncodeTile;
        *(TIFFCodeMethod *)(piVar1 + 10) = tif->tif_encodetile;
        tif->tif_encodetile = PredictorEncodeTile;
      }
    }
    else if (*piVar1 == 2) {
      uVar4 = (uint)(tif->tif_dir).td_bitspersample;
      uVar2 = uVar4 - 8 >> 3;
      uVar4 = uVar4 << 0x1d | uVar2;
      if ((uVar4 < 8) && ((0x8bU >> (uVar2 & 0x1f) & 1) != 0)) {
        *(undefined **)(piVar1 + 0xc) = (&PTR_horDiff8_0037bb80)[uVar4];
      }
      if (tif->tif_encoderow != PredictorEncodeRow) {
        *(TIFFCodeMethod *)(piVar1 + 6) = tif->tif_encoderow;
        tif->tif_encoderow = PredictorEncodeRow;
        *(TIFFCodeMethod *)(piVar1 + 8) = tif->tif_encodestrip;
        tif->tif_encodestrip = PredictorEncodeTile;
        *(TIFFCodeMethod *)(piVar1 + 10) = tif->tif_encodetile;
        tif->tif_encodetile = PredictorEncodeTile;
      }
      if ((tif->tif_flags & 0x80) != 0) {
        pcVar5 = *(code **)(piVar1 + 0xc);
        if (pcVar5 == horDiff16) {
          pcVar5 = swabHorDiff16;
        }
        else if (pcVar5 == horDiff32) {
          pcVar5 = swabHorDiff32;
        }
        else {
          if (pcVar5 != horDiff64) {
            return 1;
          }
          pcVar5 = swabHorDiff64;
        }
        *(code **)(piVar1 + 0xc) = pcVar5;
        tif->tif_postdecode = _TIFFNoPostDecode;
      }
    }
  }
  return iVar6;
}

Assistant:

static int PredictorSetupEncode(TIFF *tif)
{
    TIFFPredictorState *sp = PredictorState(tif);
    TIFFDirectory *td = &tif->tif_dir;

    if (!(*sp->setupencode)(tif) || !PredictorSetup(tif))
        return 0;

    if (sp->predictor == 2)
    {
        switch (td->td_bitspersample)
        {
            case 8:
                sp->encodepfunc = horDiff8;
                break;
            case 16:
                sp->encodepfunc = horDiff16;
                break;
            case 32:
                sp->encodepfunc = horDiff32;
                break;
            case 64:
                sp->encodepfunc = horDiff64;
                break;
        }
        /*
         * Override default encoding method with one that does the
         * predictor stuff.
         */
        if (tif->tif_encoderow != PredictorEncodeRow)
        {
            sp->encoderow = tif->tif_encoderow;
            tif->tif_encoderow = PredictorEncodeRow;
            sp->encodestrip = tif->tif_encodestrip;
            tif->tif_encodestrip = PredictorEncodeTile;
            sp->encodetile = tif->tif_encodetile;
            tif->tif_encodetile = PredictorEncodeTile;
        }

        /*
         * If the data is horizontally differenced 16-bit data that
         * requires byte-swapping, then it must be byte swapped after
         * the differentiation step.  We do this with a special-purpose
         * routine and override the normal post decoding logic that
         * the library setup when the directory was read.
         */
        if (tif->tif_flags & TIFF_SWAB)
        {
            if (sp->encodepfunc == horDiff16)
            {
                sp->encodepfunc = swabHorDiff16;
                tif->tif_postdecode = _TIFFNoPostDecode;
            }
            else if (sp->encodepfunc == horDiff32)
            {
                sp->encodepfunc = swabHorDiff32;
                tif->tif_postdecode = _TIFFNoPostDecode;
            }
            else if (sp->encodepfunc == horDiff64)
            {
                sp->encodepfunc = swabHorDiff64;
                tif->tif_postdecode = _TIFFNoPostDecode;
            }
        }
    }

    else if (sp->predictor == 3)
    {
        sp->encodepfunc = fpDiff;
        /*
         * Override default encoding method with one that does the
         * predictor stuff.
         */
        if (tif->tif_encoderow != PredictorEncodeRow)
        {
            sp->encoderow = tif->tif_encoderow;
            tif->tif_encoderow = PredictorEncodeRow;
            sp->encodestrip = tif->tif_encodestrip;
            tif->tif_encodestrip = PredictorEncodeTile;
            sp->encodetile = tif->tif_encodetile;
            tif->tif_encodetile = PredictorEncodeTile;
        }
    }

    return 1;
}